

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.h
# Opt level: O2

bool __thiscall
QItemSelectionRange::contains(QItemSelectionRange *this,int row,int column,QModelIndex *parentIndex)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QModelIndex QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QPersistentModelIndex::row();
  if (row <= iVar2) {
    iVar2 = QPersistentModelIndex::column();
    if (column <= iVar2) {
      iVar2 = QPersistentModelIndex::row();
      if (iVar2 <= row) {
        iVar2 = QPersistentModelIndex::column();
        if (iVar2 <= column) {
          QPersistentModelIndex::parent();
          bVar1 = ::comparesEqual(&QStack_48,parentIndex);
          goto LAB_00530f55;
        }
      }
    }
  }
  bVar1 = false;
LAB_00530f55:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex) const
    {
        return (br.row() >= row && br.column() >= column &&
                tl.row() <= row && tl.column() <= column &&
                parent() == parentIndex);
    }